

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::DescriptorProto::_InternalSerialize
          (DescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  string *psVar2;
  MessageOptions *this_00;
  size_t __n;
  void *pvVar3;
  uint8 *puVar4;
  Type *pTVar5;
  Type *this_01;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  Type *this_05;
  Type *s;
  int iVar6;
  int iVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.DescriptorProto.name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  iVar6 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->field_).super_RepeatedPtrFieldBase,iVar7);
    *puVar4 = '\x12';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((pTVar5->_cached_size_).size_.super___atomic_base<int>._M_i,puVar4 + 1);
    target = FieldDescriptorProto::_InternalSerialize(pTVar5,puVar4,stream);
  }
  iVar6 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_01 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                        (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar7);
    *puVar4 = '\x1a';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_01->_cached_size_).size_.super___atomic_base<int>._M_i,puVar4 + 1);
    target = _InternalSerialize(this_01,puVar4,stream);
  }
  iVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_02 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar7);
    *puVar4 = '\"';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_02->_cached_size_).size_.super___atomic_base<int>._M_i,puVar4 + 1);
    target = EnumDescriptorProto::_InternalSerialize(this_02,puVar4,stream);
  }
  iVar6 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_03 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                        (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar7);
    *puVar4 = '*';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_03->_cached_size_).size_.super___atomic_base<int>._M_i,puVar4 + 1);
    target = DescriptorProto_ExtensionRange::_InternalSerialize(this_03,puVar4,stream);
  }
  iVar6 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->extension_).super_RepeatedPtrFieldBase,iVar7);
    *puVar4 = '2';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((pTVar5->_cached_size_).size_.super___atomic_base<int>._M_i,puVar4 + 1);
    target = FieldDescriptorProto::_InternalSerialize(pTVar5,puVar4,stream);
  }
  if ((uVar1 & 2) != 0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_00 = this->options_;
    *puVar4 = ':';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,puVar4 + 1);
    target = MessageOptions::_InternalSerialize(this_00,puVar4,stream);
  }
  iVar6 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_04 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                        (&(this->oneof_decl_).super_RepeatedPtrFieldBase,iVar7);
    *puVar4 = 'B';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_04->_cached_size_).size_.super___atomic_base<int>._M_i,puVar4 + 1);
    target = OneofDescriptorProto::_InternalSerialize(this_04,puVar4,stream);
  }
  iVar6 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_05 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                        (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar7);
    *puVar4 = 'J';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_05->_cached_size_).size_.super___atomic_base<int>._M_i,puVar4 + 1);
    target = DescriptorProto_ReservedRange::_InternalSerialize(this_05,puVar4,stream);
  }
  iVar6 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  iVar7 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    s = internal::RepeatedPtrFieldBase::
        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar7);
    internal::WireFormatLite::VerifyUtf8String
              ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
               "google.protobuf.DescriptorProto.reserved_name");
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = 'R';
      target[1] = (uint8)__n;
      memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
      target = target + __n + 2;
    }
    else {
      target = io::EpsCopyOutputStream::WriteStringOutline(stream,10,s,target);
    }
  }
  pvVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8),target,stream)
    ;
    return puVar4;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* DescriptorProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_field_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(2, this->_internal_field(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_nested_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(3, this->_internal_nested_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_range_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(5, this->_internal_extension_range(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(6, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        7, _Internal::options(this), target, stream);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_oneof_decl_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(8, this->_internal_oneof_decl(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_reserved_range_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(9, this->_internal_reserved_range(i), target, stream);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->_internal_reserved_name_size(); i < n; i++) {
    const auto& s = this->_internal_reserved_name(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    target = stream->WriteString(10, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}